

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

void __thiscall sjtu::vector<sjtu::recordType>::doubleSpace(vector<sjtu::recordType> *this)

{
  void *pvVar1;
  ulong *in_RDI;
  recordType *p;
  int i;
  recordType *tmp;
  recordType *in_stack_00000058;
  recordType *in_stack_00000060;
  recordType *local_20;
  int local_14;
  recordType *this_00;
  
  local_20 = (recordType *)*in_RDI;
  *(int *)((long)in_RDI + 0xc) = *(int *)((long)in_RDI + 0xc) << 1;
  pvVar1 = operator_new((long)*(int *)((long)in_RDI + 0xc) * 0x90);
  *in_RDI = (ulong)pvVar1;
  for (local_14 = 0; this_00 = local_20, local_14 < (int)in_RDI[1]; local_14 = local_14 + 1) {
    recordType::recordType(in_stack_00000060,in_stack_00000058);
  }
  for (; local_20 < this_00 + (int)in_RDI[1]; local_20 = local_20 + 1) {
    recordType::~recordType(this_00);
  }
  operator_delete(this_00);
  return;
}

Assistant:

void doubleSpace() {
                T *tmp = data;
                maxSize *= 2;
                data = (T*) (operator new (maxSize * sizeof(T)));
                for (int i = 0; i < currentLength; ++i)
                        new (data + i) T(tmp[i]);
        for (T* p = tmp; p < tmp + currentLength; ++p)
            p->~T();
                operator delete (tmp);
        }